

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

int Cortex_FreeBodyDefs(sBodyDefs *pBodyDefs)

{
  int iVar1;
  long lVar2;
  int *in_RDI;
  sBodyDef *pBody;
  int iBody;
  int nBodies;
  int local_10;
  
  iVar1 = *in_RDI;
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    lVar2 = (long)local_10;
    if (*(long *)(in_RDI + lVar2 * 0x10 + 6) != 0) {
      free(*(void **)(in_RDI + lVar2 * 0x10 + 6));
    }
    if (*(long *)(in_RDI + lVar2 * 0x10 + 10) != 0) {
      free(*(void **)(in_RDI + lVar2 * 0x10 + 10));
    }
    if (*(long *)(in_RDI + lVar2 * 0x10 + 0xc) != 0) {
      free(*(void **)(in_RDI + lVar2 * 0x10 + 0xc));
    }
    if (*(long *)(in_RDI + lVar2 * 0x10 + 0x10) != 0) {
      free(*(void **)(in_RDI + lVar2 * 0x10 + 0x10));
    }
  }
  if (*(long *)(in_RDI + 0x644) != 0) {
    free(*(void **)(in_RDI + 0x644));
  }
  if (*(long *)(in_RDI + 0x648) != 0) {
    free(*(void **)(in_RDI + 0x648));
  }
  memset(in_RDI,0,0x40);
  free(in_RDI);
  return 0;
}

Assistant:

int Cortex_FreeBodyDefs(sBodyDefs* pBodyDefs)
{
  int nBodies = pBodyDefs->nBodyDefs;
  int iBody;

  for (iBody = 0; iBody < nBodies; iBody++) {
    sBodyDef *pBody = &pBodyDefs->BodyDefs[iBody];

    // Free each array of pointers to the names
    if (pBody->szMarkerNames != NULL)
      free(pBody->szMarkerNames);
    if (pBody->Hierarchy.szSegmentNames != NULL)
      free(pBody->Hierarchy.szSegmentNames);
    if (pBody->Hierarchy.iParents != NULL)
      free(pBody->Hierarchy.iParents);
    if (pBody->szDofNames != NULL)
      free(pBody->szDofNames);
  }

  if (pBodyDefs->szAnalogChannelNames != NULL)
    free(pBodyDefs->szAnalogChannelNames);

  // Free the big space that contains all the names
  if (pBodyDefs->AllocatedSpace != NULL)
    free(pBodyDefs->AllocatedSpace);
  memset(pBodyDefs, 0, sizeof(sBodyDef)); // not needed anymore
  free(pBodyDefs);

  return RC_Okay;
}